

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>::
FunctionMockerBase(FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)> *this)

{
  UntypedFunctionMockerBase *in_RDI;
  FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)> *in_stack_ffffffffffffffd8;
  
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(in_RDI);
  in_RDI->_vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMockerBase_0042edf0;
  MockSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>::MockSpec
            ((MockSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)> *)in_RDI,
             in_stack_ffffffffffffffd8);
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}